

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# libfsst.hpp
# Opt level: O1

bool __thiscall SymbolTable::add(SymbolTable *this,Symbol s)

{
  ushort uVar1;
  byte bVar2;
  long lVar3;
  anon_union_8_2_43acef4c_for_val aVar4;
  int iVar5;
  ulong uVar6;
  ulong uVar7;
  uint uVar8;
  
  aVar4 = s.val;
  uVar6 = s.icl >> 0x1c;
  uVar1 = this->nSymbols;
  lVar3 = uVar6 * -8 + 0x40;
  uVar7 = (ulong)((uint)lVar3 | (uint)s.icl & 0xf0000000 | (uint)uVar1 * 0x10000 + 0x1000000);
  iVar5 = (int)uVar6;
  if (iVar5 == 2) {
    this->shortCodes[aVar4.num & 0xffff] = uVar1 + 0x2100;
  }
  else if (iVar5 == 1) {
    this->byteCodes[aVar4.num & 0xff] = uVar1 + 0x1100;
  }
  else {
    uVar8 = (s.val._0_4_ & 0xffffff) * -0x4ee6db1f;
    uVar6 = (ulong)(((uVar8 >> 0xf ^ uVar8) & 0x3ff) << 4);
    if (*(ulong *)((long)&this->hashTab[0].icl + uVar6) < 0xf1ff0000) {
      return false;
    }
    *(ulong *)((long)&this->hashTab[0].icl + uVar6) = uVar7;
    bVar2 = (byte)lVar3;
    *(u64 *)((long)&this->hashTab[0].val + uVar6) = (aVar4.num << (bVar2 & 0x38)) >> (bVar2 & 0x38);
  }
  this->nSymbols = uVar1 + 1;
  this->symbols[(ulong)uVar1 + 0x100].val.num = (u64)aVar4;
  this->symbols[(ulong)uVar1 + 0x100].icl = uVar7;
  this->lenHisto[iVar5 - 1] = this->lenHisto[iVar5 - 1] + 1;
  return true;
}

Assistant:

bool add(Symbol s) {
      assert(FSST_CODE_BASE + nSymbols < FSST_CODE_MAX);
      u32 len = s.length();
      s.set_code_len(FSST_CODE_BASE + nSymbols, len);
      if (len == 1) {
         byteCodes[s.first()] = FSST_CODE_BASE + nSymbols + (1<<FSST_LEN_BITS); // len=1 (<<FSST_LEN_BITS)
      } else if (len == 2) {
         shortCodes[s.first2()] = FSST_CODE_BASE + nSymbols + (2<<FSST_LEN_BITS); // len=2 (<<FSST_LEN_BITS)
      } else if (!hashInsert(s)) {
         return false;
      }
      symbols[FSST_CODE_BASE + nSymbols++] = s;
      lenHisto[len-1]++;
      return true;
   }